

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_file_sink-inl.h
# Opt level: O0

void __thiscall
spdlog::sinks::basic_file_sink<spdlog::details::null_mutex>::sink_it_
          (basic_file_sink<spdlog::details::null_mutex> *this,log_msg *msg)

{
  pointer pfVar1;
  size_t in_RCX;
  void *__buf;
  allocator<char> local_139;
  undefined1 local_138 [8];
  memory_buf_t formatted;
  log_msg *msg_local;
  basic_file_sink<spdlog::details::null_mutex> *this_local;
  
  formatted._280_8_ = msg;
  std::allocator<char>::allocator();
  fmt::v10::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::basic_memory_buffer
            ((basic_memory_buffer<char,_250UL,_std::allocator<char>_> *)local_138,&local_139);
  std::allocator<char>::~allocator(&local_139);
  pfVar1 = std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::operator->
                     (&(this->super_base_sink<spdlog::details::null_mutex>).formatter_);
  (*pfVar1->_vptr_formatter[2])(pfVar1,formatted._280_8_,local_138);
  details::file_helper::write(&this->file_helper_,(int)local_138,__buf,in_RCX);
  fmt::v10::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_250UL,_std::allocator<char>_> *)local_138);
  return;
}

Assistant:

SPDLOG_INLINE void basic_file_sink<Mutex>::sink_it_(const details::log_msg &msg) {
    memory_buf_t formatted;
    base_sink<Mutex>::formatter_->format(msg, formatted);
    file_helper_.write(formatted);
}